

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

char * spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_extension_name(Candidate c)

{
  Candidate c_local;
  
  return get_extension_name::retval[c];
}

Assistant:

const char *CompilerGLSL::ShaderSubgroupSupportHelper::get_extension_name(Candidate c)
{
	static const char * const retval[CandidateCount] = {
		"GL_KHR_shader_subgroup_ballot",
		"GL_KHR_shader_subgroup_basic",
		"GL_KHR_shader_subgroup_vote",
		"GL_NV_gpu_shader_5",
		"GL_NV_shader_thread_group",
		"GL_NV_shader_thread_shuffle",
		"GL_ARB_shader_ballot",
		"GL_ARB_shader_group_vote",
		"GL_AMD_gcn_shader"
	};
	return retval[c];
}